

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImStb::STB_TEXTEDIT_DELETECHARS(ImGuiInputTextState *obj,int pos,int n)

{
  int iVar1;
  unsigned_short *puStack_28;
  ImWchar c;
  ImWchar *src;
  ImWchar *dst;
  int n_local;
  int pos_local;
  ImGuiInputTextState *obj_local;
  
  src = (obj->TextW).Data + pos;
  iVar1 = ImTextCountUtf8BytesFromStr(src,src + n);
  obj->CurLenA = obj->CurLenA - iVar1;
  obj->CurLenW = obj->CurLenW - n;
  puStack_28 = (obj->TextW).Data + (long)pos + (long)n;
  while( true ) {
    if (*puStack_28 == 0) break;
    *src = *puStack_28;
    puStack_28 = puStack_28 + 1;
    src = src + 1;
  }
  *src = 0;
  return;
}

Assistant:

static void STB_TEXTEDIT_DELETECHARS(STB_TEXTEDIT_STRING* obj, int pos, int n)
{
    ImWchar* dst = obj->TextW.Data + pos;

    // We maintain our buffer length in both UTF-8 and wchar formats
    obj->CurLenA -= ImTextCountUtf8BytesFromStr(dst, dst + n);
    obj->CurLenW -= n;

    // Offset remaining text (FIXME-OPT: Use memmove)
    const ImWchar* src = obj->TextW.Data + pos + n;
    while (ImWchar c = *src++)
        *dst++ = c;
    *dst = '\0';
}